

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

xmlHashedString xmlDictLookupHashed(xmlDictPtr dict,xmlChar *name,int len)

{
  xmlDictEntry *pxVar1;
  xmlHashedString xVar2;
  xmlDictEntry *entry;
  int len_local;
  xmlChar *name_local;
  xmlDictPtr dict_local;
  xmlHashedString ret;
  
  pxVar1 = xmlDictLookupInternal(dict,(xmlChar *)0x0,name,len,1);
  if (pxVar1 == (xmlDictEntry *)0x0) {
    ret.hashValue = 0;
    ret._4_4_ = 0;
    dict_local = (xmlDictPtr)0x0;
  }
  else {
    dict_local = *(xmlDictPtr *)pxVar1;
    ret._0_8_ = pxVar1->name;
  }
  xVar2._0_8_ = (ulong)dict_local & 0xffffffff;
  xVar2.name = (xmlChar *)ret._0_8_;
  return xVar2;
}

Assistant:

xmlHashedString
xmlDictLookupHashed(xmlDictPtr dict, const xmlChar *name, int len) {
    const xmlDictEntry *entry;
    xmlHashedString ret;

    entry = xmlDictLookupInternal(dict, NULL, name, len, 1);

    if (entry == NULL) {
        ret.name = NULL;
        ret.hashValue = 0;
    } else {
        ret = *entry;
    }

    return(ret);
}